

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
vkt::(anonymous_namespace)::generateVertexSpecialization_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          ProgramSpecializationParams *specParams)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  DataType dataType;
  DataType dataType_00;
  char *pcVar5;
  char *__s;
  ostream *poVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ostringstream decl;
  ostringstream setup;
  undefined1 auStack_3a8 [8];
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_3a0;
  int local_398;
  int local_394;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  _anonymous_namespace_ *local_370;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  ulong local_328;
  long local_320 [14];
  ios_base local_2b0 [264];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_370 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3a0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               *)__return_storage_ptr__;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"layout(location = 0) in highp vec4 dEQP_Position;\n",0x32);
  lVar9 = *(long *)local_370;
  lVar11 = *(long *)(lVar9 + 0x30);
  if (*(long *)(lVar9 + 0x38) != lVar11) {
    local_398 = 1;
    lVar10 = 0x20;
    uVar8 = 0;
    do {
      dataType = *(DataType *)(lVar11 + -0x18 + lVar10);
      local_328 = uVar8;
      pcVar5 = glu::getDataTypeName(dataType);
      dataType_00 = vkt::anon_unknown_0::getTransportType(dataType);
      __s = glu::getDataTypeName(dataType_00);
      local_394 = 1;
      if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
        local_394 = glu::getDataTypeMatrixNumColumns(dataType);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"layout(location = ",0x12);
      poVar6 = (ostream *)std::ostream::operator<<(local_320,local_398);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") in ",5);
      if (dataType == dataType_00) {
        if (__s == (char *)0x0) {
          std::ios::clear((int)auStack_3a8 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x88);
        }
        else {
          sVar7 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,__s,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_320,*(char **)(lVar11 + -8 + lVar10),
                            *(long *)(lVar11 + lVar10));
        lVar9 = 2;
        pcVar5 = ";\n";
      }
      else {
        if (__s == (char *)0x0) {
          std::ios::clear((int)auStack_3a8 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x88);
        }
        else {
          sVar7 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,__s,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," a_",3);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_320,*(char **)(lVar11 + -8 + lVar10),
                            *(long *)(lVar11 + lVar10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)auStack_3a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x200);
        }
        else {
          sVar7 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)(lVar11 + -8 + lVar10),
                            *(long *)(lVar11 + lVar10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar5,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(a_",3);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,*(char **)(lVar11 + -8 + lVar10),*(long *)(lVar11 + lVar10));
        lVar9 = 3;
        pcVar5 = ");\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar5,lVar9);
      local_398 = local_398 + local_394;
      uVar8 = local_328 + 1;
      lVar9 = *(long *)local_370;
      lVar11 = *(long *)(lVar9 + 0x30);
      lVar10 = lVar10 + 0x50;
    } while (uVar8 < (ulong)((*(long *)(lVar9 + 0x38) - lVar11 >> 4) * -0x3333333333333333));
  }
  vkt::anon_unknown_0::declareUniforms((ostringstream *)local_320,(ValueBlock *)(lVar9 + 0x30));
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_368,(char (*) [20])"VERTEX_DECLARATIONS",&local_390);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_3a0,&local_368);
  paVar2 = &local_368.second.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.second._M_dataplus._M_p != paVar2) {
    operator_delete(local_368.second._M_dataplus._M_p,
                    local_368.second.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_368.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_368.first._M_dataplus._M_p,
                    local_368.first.field_2._M_allocated_capacity + 1);
  }
  paVar4 = &local_390.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar4) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_368,(char (*) [13])"VERTEX_SETUP",&local_390);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_3a0,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.second._M_dataplus._M_p != paVar2) {
    operator_delete(local_368.second._M_dataplus._M_p,
                    local_368.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_368.first._M_dataplus._M_p,
                    local_368.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar4) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  local_390._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_390,"gl_Position = dEQP_Position;\n","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_368,(char (*) [14])"VERTEX_OUTPUT",&local_390);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_3a0,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.second._M_dataplus._M_p != paVar2) {
    operator_delete(local_368.second._M_dataplus._M_p,
                    local_368.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_368.first._M_dataplus._M_p,
                    local_368.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar4) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_3a0;
}

Assistant:

map<string, string> generateVertexSpecialization (const ProgramSpecializationParams& specParams)
{
	ostringstream			decl;
	ostringstream			setup;
	map<string, string>		params;
	int						curInputLoc		= 0;

	decl << "layout(location = 0) in highp vec4 dEQP_Position;\n";
	curInputLoc += 1;

	for (size_t ndx = 0; ndx < specParams.caseSpec.values.inputs.size(); ndx++)
	{
		const Value&		val					= specParams.caseSpec.values.inputs[ndx];
		const DataType		valueType			= val.type.getBasicType();
		const char*	const	valueTypeStr		= getDataTypeName(valueType);
		const DataType		transportType		= getTransportType(valueType);
		const char* const	transportTypeStr	= getDataTypeName(transportType);
		const int			numLocs				= getNumTransportLocations(valueType);

		decl << "layout(location = " << curInputLoc << ") in ";

		curInputLoc += numLocs;

		if (valueType == transportType)
			decl << transportTypeStr << " " << val.name << ";\n";
		else
		{
			decl << transportTypeStr << " a_" << val.name << ";\n";
			setup << valueTypeStr << " " << val.name << " = " << valueTypeStr << "(a_" << val.name << ");\n";
		}
	}

	declareUniforms(decl, specParams.caseSpec.values);

	params.insert(pair<string, string>("VERTEX_DECLARATIONS",	decl.str()));
	params.insert(pair<string, string>("VERTEX_SETUP",			setup.str()));
	params.insert(pair<string, string>("VERTEX_OUTPUT",			string("gl_Position = dEQP_Position;\n")));

	return params;
}